

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O3

void alloc_fs_workspace(j_decompress_ptr cinfo)

{
  JDIMENSION JVar1;
  jpeg_color_quantizer *pjVar2;
  _func_void_j_decompress_ptr *p_Var3;
  long lVar4;
  
  if (0 < cinfo->out_color_components) {
    JVar1 = cinfo->output_width;
    pjVar2 = cinfo->cquantize;
    lVar4 = 0;
    do {
      p_Var3 = (_func_void_j_decompress_ptr *)
               (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,(ulong)(JVar1 + 2) * 2);
      (&pjVar2[3].finish_pass)[lVar4] = p_Var3;
      lVar4 = lVar4 + 1;
    } while (lVar4 < cinfo->out_color_components);
  }
  return;
}

Assistant:

LOCAL(void)
alloc_fs_workspace (j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  size_t arraysize;
  int i;

  arraysize = (size_t) ((cinfo->output_width + 2) * SIZEOF(FSERROR));
  for (i = 0; i < cinfo->out_color_components; i++) {
    cquantize->fserrors[i] = (FSERRPTR)
      (*cinfo->mem->alloc_large)((j_common_ptr) cinfo, JPOOL_IMAGE, arraysize);
  }
}